

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

uint16 * __thiscall
Js::FunctionExecutionStateMachine::GetStateLimit
          (FunctionExecutionStateMachine *this,ExecutionState state)

{
  code *pcVar1;
  bool bVar2;
  ulong uVar3;
  undefined4 *puVar4;
  
  if (state < FullJit) {
    uVar3 = (ulong)(byte)(state * '\x02' + 10);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x1f8,"(!\"Unexpected ExecutionState for limit\")",
                                "!\"Unexpected ExecutionState for limit\"");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = 10;
  }
  return (uint16 *)((long)&(this->owner).ptr + uVar3);
}

Assistant:

uint16& FunctionExecutionStateMachine::GetStateLimit(ExecutionState state)
    {
        switch (state)
        {
        case ExecutionState::Interpreter:
            return interpreterLimit;

        case ExecutionState::AutoProfilingInterpreter0:
            return autoProfilingInterpreter0Limit;

        case ExecutionState::AutoProfilingInterpreter1:
            return autoProfilingInterpreter1Limit;

        case ExecutionState::ProfilingInterpreter0:
            return profilingInterpreter0Limit;

        case ExecutionState::ProfilingInterpreter1:
            return profilingInterpreter1Limit;

        case ExecutionState::SimpleJit:
            return simpleJitLimit;

        default:
            Assert(!"Unexpected ExecutionState for limit");
            return interpreterLimit;
        }
    }